

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

void CVmBifTADS::toIntOrNum(uint argc,int int_only)

{
  vm_val_t *val_00;
  uint uVar1;
  vm_val_t *pvVar2;
  int iVar3;
  int32_t iVar4;
  vm_datatype_t vVar5;
  int iVar6;
  ushort *puVar7;
  ulong uVar8;
  ushort *puVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  vm_val_t val;
  vm_val_t local_40;
  
  CVmBif::check_argc_range(argc,1,2);
  pvVar2 = sp_;
  vVar5 = sp_[-1].typ;
  if (vVar5 == VM_OBJ) {
    val_00 = sp_ + -1;
    iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                   [sp_[-1].val.obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc] + (sp_[-1].val.obj & 0xfff),
                       CVmObjBigNum::metaclass_reg_);
    if (iVar3 == 0) {
      vVar5 = val_00->typ;
      goto LAB_00258b75;
    }
    if (int_only == 0) {
      CVmBif::retval(val_00);
      goto LAB_00258b97;
    }
    uVar1 = pvVar2[-1].val.obj;
    iVar4 = CVmObjBigNum::convert_to_int
                      ((CVmObjBigNum *)
                       ((long)&G_obj_table_X.pages_[uVar1 >> 0xc]->ptr_ +
                       (ulong)((uVar1 & 0xfff) * 0x18)));
    uVar8 = (ulong)iVar4;
  }
  else {
LAB_00258b75:
    if (vVar5 - VM_NIL < 2) {
      uVar8 = (ulong)(vVar5 == VM_TRUE);
    }
    else {
      if (vVar5 != VM_INT) {
        puVar7 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
        if (puVar7 == (ushort *)0x0) {
          err_throw(0x7e3);
        }
        uVar8 = (ulong)*puVar7;
        iVar3 = 10;
        if (1 < argc) {
          if (sp_[-2].typ == VM_INT) {
            iVar3 = sp_[-2].val.intval;
          }
          else {
            iVar3 = vm_val_t::nonint_num_to_int(sp_ + -2);
          }
          if (iVar3 - 0x25U < 0xffffffdd) {
            err_throw(0x902);
          }
        }
        if (uVar8 != 0) {
          lVar11 = -uVar8;
          puVar9 = puVar7 + 1;
          do {
            if (((char)*puVar9 < '\0') || (iVar6 = isspace((int)(char)*puVar9), iVar6 == 0)) {
              if (lVar11 != 0) {
                lVar10 = 0;
                goto LAB_00258c64;
              }
              break;
            }
            puVar9 = (ushort *)((long)puVar9 + 1);
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0);
        }
        goto LAB_00258cb9;
      }
      uVar8 = (ulong)pvVar2[-1].val.intval;
    }
  }
  CVmBif::retval_int(uVar8);
  goto LAB_00258b97;
  while (bVar12 = lVar11 + 1 != lVar10, lVar10 = lVar10 + -1, bVar12) {
LAB_00258c64:
    iVar6 = (int)*(char *)((long)puVar7 + lVar10 + uVar8 + 1);
    if ((iVar6 < 0) || (iVar6 = isspace(iVar6), iVar6 == 0)) {
      if (lVar10 - lVar11 == 4) {
        if (*(int *)puVar9 != 0x65757274) break;
        lVar11 = 1;
      }
      else {
        if ((lVar10 - lVar11 != 3) || ((char)puVar9[1] != 'l' || *puVar9 != 0x696e)) break;
        lVar11 = 0;
      }
      CVmBif::retval_int(lVar11);
      goto LAB_00258b97;
    }
  }
LAB_00258cb9:
  CVmObjString::parse_num_val(&local_40,(char *)(puVar7 + 1),uVar8,iVar3,int_only);
  CVmBif::retval(&local_40);
LAB_00258b97:
  sp_ = sp_ + -(long)(int)argc;
  return;
}

Assistant:

void CVmBifTADS::toIntOrNum(VMG_ uint argc, int int_only)
{    
    /* check arguments */
    check_argc_range(vmg_ argc, 1, 2);

    /* check for BigNumber values */
    vm_val_t *valp = G_stk->get(0);
    if (valp->typ == VM_OBJ
        && CVmObjBigNum::is_bignum_obj(vmg_ valp->val.obj))
    {
        /*
         *   If we only want integer results, try converting the BigNumber to
         *   an integer.  Otherwise, simply return the BigNumber as-is. 
         */
        if (int_only)
        {
            /* we only want an integer result - convert to int */
            long intval = ((CVmObjBigNum *)vm_objp(vmg_ valp->val.obj))
                          ->convert_to_int();

            /* return the integer value */
            retval_int(vmg_ intval);
        }
        else
        {
            /* BigNumber results are okay - just return the BigNumber */
            retval(vmg_ valp);
        }
        
        /* discard arguments, and we're done */
        G_stk->discard(argc);
        return;
    }

    /* if it's already an integer, just return the same value */
    if (valp->typ == VM_INT)
    {
        /* just return the argument value */
        retval_int(vmg_ valp->val.intval);

        /* discard arguments and return */
        G_stk->discard(argc);
        return;
    }

    /* if it's true or nil, convert to 1 or 0 */
    if (valp->typ == VM_TRUE || valp->typ == VM_NIL)
    {
        /* return 1 for true, 0 for nil */
        retval_int(vmg_ valp->typ == VM_TRUE ? 1 : 0);
        G_stk->discard(argc);
        return;
    }

    /* the only other type of value we can convert is a string */
    const char *strp = G_stk->get(0)->get_as_string(vmg0_);
    if (strp == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* get the string length and buffer pointer */
    size_t len = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a radix specified, pop it as well; the default is 10 */
    int radix = 10;
    if (argc >= 2)
    {
        /* get the radix from the stack */
        radix = G_stk->get(1)->num_to_int(vmg0_);

        /* make sure it's in the valid range */
        if (radix < 2 || radix > 36)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /* get a version of the string stripped of leading and trailing spaces */
    const char *p2 = strp;
    size_t len2 = len;
    for ( ; len2 != 0 && is_space(*p2) ; ++p2, --len2) ;
    for ( ; len2 != 0 && is_space(*(p2 + len2 - 1)) ; --len2) ;

    /* 
     *   Check for "nil" and "true", ignoring leading and trailing spaces; if
     *   it matches either of those, return the corresponding boolean value.
     *   Otherwise, parse the string as an integer value in the given radix.
     */
    if (len2 == 3 && memcmp(p2, "nil", 3) == 0)
    {
        /* the value for "nil" is 0 */
        retval_int(vmg_ 0);
    }
    else if (len2 == 4 && memcmp(p2, "true", 4) == 0)
    {
        /* the value for "true" is 1 */
        retval_int(vmg_ 1);
    }
    else
    {
        /* parse the string as an integer (orBigNumber if it's too large) */
        vm_val_t val;
        CVmObjString::parse_num_val(vmg_ &val, strp, len, radix, int_only);
        retval(vmg_ &val);
    }

    /* discard arguments */
    G_stk->discard(argc);
}